

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

ostream * absl::operator<<(ostream *out,Cord *cord)

{
  reference rVar1;
  ChunkIterator __begin1;
  ChunkIterator CStack_a8;
  
  Cord::ChunkIterator::ChunkIterator(&CStack_a8,cord);
  while (CStack_a8.bytes_remaining_ != 0) {
    rVar1 = Cord::ChunkIterator::operator*(&CStack_a8);
    std::ostream::write((char *)out,(long)rVar1._M_str);
    Cord::ChunkIterator::operator++(&CStack_a8);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    out.write(chunk.data(), static_cast<std::streamsize>(chunk.size()));
  }
  return out;
}